

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFileListGeneratorCaseInsensitive::~cmFileListGeneratorCaseInsensitive
          (cmFileListGeneratorCaseInsensitive *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmFileListGeneratorBase *pcVar3;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorCaseInsensitive_005b81d8;
  pcVar2 = (this->String)._M_dataplus._M_p;
  paVar1 = &(this->String).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorBase_005b81a8;
  pcVar3 = (this->super_cmFileListGeneratorBase).Next._M_t.
           super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
           .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
  if (pcVar3 != (cmFileListGeneratorBase *)0x0) {
    (*pcVar3->_vptr_cmFileListGeneratorBase[1])();
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

cmFileListGeneratorCaseInsensitive(std::string str)
    : String(std::move(str))
  {
  }